

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall
CLI::RequiredError::RequiredError(RequiredError *this,string *msg,ExitCodes exit_code)

{
  allocator local_69;
  string local_68;
  string local_48;
  
  ::std::__cxx11::string::string((string *)&local_48,"RequiredError",&local_69);
  ::std::__cxx11::string::string((string *)&local_68,(string *)msg);
  ParseError::ParseError(&this->super_ParseError,&local_48,&local_68,exit_code);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&(this->super_ParseError).super_Error = &PTR__Error_0011acb0;
  return;
}

Assistant:

static RequiredError Subcommand(size_t min_subcom) {
        if(min_subcom == 1)
            return RequiredError("A subcommand");
        else
            return RequiredError("Requires at least " + std::to_string(min_subcom) + " subcommands",
                                 ExitCodes::RequiredError);
    }